

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_subdiv.c
# Opt level: O2

REF_INT ref_subdiv_c2e(REF_SUBDIV ref_subdiv,REF_CELL ref_cell,REF_INT cell_edge,REF_INT cell)

{
  REF_INT *pRVar1;
  uint uVar2;
  long lVar3;
  char *pcVar4;
  undefined8 uStack_20;
  REF_INT edge;
  
  if ((-1 < cell) && (cell < ref_cell->max)) {
    pRVar1 = ref_cell->c2n;
    lVar3 = (long)cell * (long)ref_cell->size_per;
    if (pRVar1[lVar3] != -1) {
      if (cell_edge < ref_cell->edge_per) {
        lVar3 = (long)(int)lVar3;
        uVar2 = ref_edge_with(ref_subdiv->edge,pRVar1[ref_cell->e2n[cell_edge * 2] + lVar3],
                              pRVar1[ref_cell->e2n[cell_edge * 2 + 1] + lVar3],&edge);
        if (uVar2 != 0) {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
                 0x2f,"ref_subdiv_c2e",(ulong)uVar2,"look up edge");
        }
        return -(uint)(uVar2 != 0) | edge;
      }
      pcVar4 = "invalid edge index";
      uStack_20 = 0x29;
      goto LAB_0019ef7f;
    }
  }
  pcVar4 = "invalid cell index";
  uStack_20 = 0x28;
LAB_0019ef7f:
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_subdiv.c",
         uStack_20,"ref_subdiv_c2e",pcVar4);
  return -1;
}

Assistant:

static REF_INT ref_subdiv_c2e(REF_SUBDIV ref_subdiv, REF_CELL ref_cell,
                              REF_INT cell_edge, REF_INT cell) {
  REF_INT node0, node1, edge;

  RAE(ref_cell_valid(ref_cell, cell), "invalid cell index");
  RAE(cell_edge < ref_cell_edge_per(ref_cell), "invalid edge index");

  node0 = ref_cell_e2n(ref_cell, 0, cell_edge, cell);
  node1 = ref_cell_e2n(ref_cell, 1, cell_edge, cell);

  RSE(ref_edge_with(ref_subdiv_edge(ref_subdiv), node0, node1, &edge),
      "look up edge");

  return edge;
}